

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall DPlayerMenu::Init(DPlayerMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  ulong uVar1;
  int iVar2;
  PType *pPVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  FListMenuItem *pFVar6;
  char *pcVar7;
  undefined8 *puVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 local_70 [20];
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  DListMenu::Init(&this->super_DListMenu,parent,desc);
  PickPlayerClass(this);
  this->mRotation = 0;
  local_34.Index = 0x20c;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_34);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0x10001,0);
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0x10004,1);
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0x10005,1);
    puVar5 = (undefined8 *)
             ((ulong)(((&DAT_017e1e88)[(long)consoleplayer * 0xa8] - 1 & 0x23c) * 0x18) +
             (&DAT_017e1e78)[(long)consoleplayer * 0x54]);
    do {
      puVar8 = puVar5;
      puVar5 = (undefined8 *)*puVar8;
    } while (*(int *)(puVar8 + 1) != 0x23c);
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0x10003,(ulong)*(uint *)(puVar8[2] + 0x28));
    if ((this->PlayerClass != (FPlayerClass *)0x0) &&
       (((this->PlayerClass->Type->super_PClassActor).super_PClass.Defaults[0x1c8] & 0x20) == 0)) {
      puVar5 = (undefined8 *)
               ((&DAT_017e1e78)[(long)consoleplayer * 0x54] +
               (ulong)((&DAT_017e1e88)[(long)consoleplayer * 0xa8] + 0x3ff & 0x23c) * 0x18);
      do {
        puVar8 = puVar5;
        puVar5 = (undefined8 *)*puVar8;
      } while (*(int *)(puVar8 + 1) != 0x23c);
      if (*(int *)(puVar8[2] + 0x28) != -1) {
        puVar5 = (undefined8 *)
                 ((&DAT_017e1e78)[(long)consoleplayer * 0x54] +
                 (ulong)((&DAT_017e1e88)[(long)consoleplayer * 0xa8] + 0x3ff & 0x208) * 0x18);
        do {
          puVar8 = puVar5;
          puVar5 = (undefined8 *)*puVar8;
        } while (*(int *)(puVar8 + 1) != 0x208);
        (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0x10002,(ulong)*(uint *)(puVar8[2] + 0x28));
      }
    }
  }
  local_38.Index = 0x202;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_38);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,0,::name.Value);
  }
  local_3c.Index = 0x203;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_3c);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,0,"None");
    if (Teams.Count != 0) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 1;
        pcVar7 = FTeam::GetName((FTeam *)((long)&(Teams.Array)->m_iPlayerCount + lVar10));
        (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,uVar11 & 0xffffffff,pcVar7);
        lVar10 = lVar10 + 0x38;
      } while (uVar11 < Teams.Count);
    }
    uVar11 = (ulong)(team.Value + 1);
    if (team.Value == 0xff) {
      uVar11 = 0;
    }
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,uVar11);
  }
  puVar5 = (undefined8 *)
           ((&DAT_017e1e78)[(long)consoleplayer * 0x54] +
           (ulong)((&DAT_017e1e88)[(long)consoleplayer * 0xa8] + 0x3ff & 0x237) * 0x18);
  do {
    puVar8 = puVar5;
    puVar5 = (undefined8 *)*puVar8;
  } while (*(int *)(puVar8 + 1) != 0x237);
  iVar2 = *(int *)(puVar8[2] + 0x28);
  puVar5 = (undefined8 *)
           ((&DAT_017e1e78)[(long)consoleplayer * 0x54] +
           (ulong)((&DAT_017e1e88)[(long)consoleplayer * 0xa8] + 0x3ff & 0x204) * 0x18);
  do {
    puVar8 = puVar5;
    puVar5 = (undefined8 *)*puVar8;
  } while (*(int *)(puVar8 + 1) != 0x204);
  uVar9 = *(uint *)(puVar8[2] + 0x28);
  UpdateColorsets(this);
  local_40.Index = 0x205;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_40);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[0xc])(pFVar6,(ulong)(iVar2 == -1));
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)(uVar9 >> 0x10 & 0xff));
  }
  local_44.Index = 0x206;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_44);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[0xc])(pFVar6,(ulong)(iVar2 == -1));
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)(uVar9 >> 8 & 0xff));
  }
  local_48.Index = 0x207;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_48);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[0xc])(pFVar6,(ulong)(iVar2 == -1));
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)(uVar9 & 0xff));
  }
  local_4c.Index = 5;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_4c);
  if (pFVar6 != (FListMenuItem *)0x0) {
    if (PlayerClasses.Count == 1) {
      GetPrintableDisplayName((PClassPlayerPawn *)local_70);
      uVar9 = 0;
      (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,0,local_70._0_8_);
      FString::~FString((FString *)local_70);
    }
    else {
      local_70._8_8_ = this;
      if (gameinfo.norandomplayerclass == false) {
        (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,0,"Random");
      }
      if (PlayerClasses.Count != 0) {
        uVar11 = 0;
        do {
          GetPrintableDisplayName((PClassPlayerPawn *)local_70);
          uVar4 = local_70._0_8_;
          FString::~FString((FString *)local_70);
          uVar1 = uVar11 + 1;
          if (gameinfo.norandomplayerclass == false) {
            uVar11 = uVar1;
          }
          (*pFVar6->_vptr_FListMenuItem[8])(pFVar6,uVar11 & 0xffffffff,uVar4);
          uVar11 = uVar1;
        } while (uVar1 < PlayerClasses.Count);
      }
      puVar5 = (undefined8 *)
               ((ulong)(((&DAT_017e1e88)[(long)consoleplayer * 0xa8] - 1 & 0x23c) * 0x18) +
               (&DAT_017e1e78)[(long)consoleplayer * 0x54]);
      do {
        puVar8 = puVar5;
        puVar5 = (undefined8 *)*puVar8;
      } while (*(int *)(puVar8 + 1) != 0x23c);
      uVar9 = (uint)(byte)(*(int *)(puVar8[2] + 0x28) < 0 | gameinfo.norandomplayerclass ^ 1U) +
              *(int *)(puVar8[2] + 0x28);
      this = (DPlayerMenu *)local_70._8_8_;
    }
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)uVar9);
  }
  UpdateSkins(this);
  local_50.Index = 0x209;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_50);
  if (pFVar6 != (FListMenuItem *)0x0) {
    puVar5 = (undefined8 *)
             ((ulong)(((&DAT_017e1e88)[(long)consoleplayer * 0xa8] - 1 & 0x209) * 0x18) +
             (&DAT_017e1e78)[(long)consoleplayer * 0x54]);
    do {
      puVar8 = puVar5;
      puVar5 = (undefined8 *)*puVar8;
    } while (*(int *)(puVar8 + 1) != 0x209);
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)*(uint *)(puVar8[2] + 0x28));
  }
  local_54.Index = 0x20a;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_54);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)(uint)(int)autoaim.Value);
  }
  local_58.Index = 0x20b;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_58);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)neverswitchonpickup.Value);
  }
  local_5c.Index = 0x22d;
  pFVar6 = DListMenu::GetItem(&this->super_DListMenu,&local_5c);
  if (pFVar6 != (FListMenuItem *)0x0) {
    (*pFVar6->_vptr_FListMenuItem[10])(pFVar6,0,(ulong)cl_run.Value);
  }
  pPVar3 = (((PClass *)this)->super_PNativeStruct).super_PStruct.super_PNamedType.
           super_PCompoundType.super_PType.HashNext;
  if (*(int *)&(pPVar3->Symbols).ParentSymbolTable < 0) {
    *(undefined4 *)&(pPVar3->Symbols).ParentSymbolTable = 1;
  }
  return;
}

Assistant:

void DPlayerMenu::Init(DMenu *parent, FListMenuDescriptor *desc)
{
	FListMenuItem *li;

	Super::Init(parent, desc);
	PickPlayerClass();
	mRotation = 0;

	li = GetItem(NAME_Playerdisplay);
	if (li != NULL)
	{
		li->SetValue(FListMenuItemPlayerDisplay::PDF_ROTATION, 0);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_MODE, 1);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_TRANSLATE, 1);
		li->SetValue(FListMenuItemPlayerDisplay::PDF_CLASS, players[consoleplayer].userinfo.GetPlayerClassNum());
		if (PlayerClass != NULL && !(GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN) &&
			players[consoleplayer].userinfo.GetPlayerClassNum() != -1)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, players[consoleplayer].userinfo.GetSkin());
		}
	}

	li = GetItem(NAME_Playerbox);
	if (li != NULL)
	{
		li->SetString(0, name);
	}

	li = GetItem(NAME_Team);
	if (li != NULL)
	{
		li->SetString(0, "None");
		for(unsigned i=0;i<Teams.Size(); i++)
		{
			li->SetString(i+1, Teams[i].GetName());
		}
		li->SetValue(0, team == TEAM_NONE? 0 : team + 1);
	}

	int mycolorset = players[consoleplayer].userinfo.GetColorSet();
	int color = players[consoleplayer].userinfo.GetColor();

	UpdateColorsets();

	li = GetItem(NAME_Red);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, RPART(color));
	}

	li = GetItem(NAME_Green);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, GPART(color));
	}

	li = GetItem(NAME_Blue);
	if (li != NULL)
	{
		li->Enable(mycolorset == -1);
		li->SetValue(0, BPART(color));
	}

	li = GetItem(NAME_Class);
	if (li != NULL)
	{
		if (PlayerClasses.Size() == 1)
		{
			li->SetString(0, GetPrintableDisplayName(PlayerClasses[0].Type));
			li->SetValue(0, 0);
		}
		else
		{
			// [XA] Remove the "Random" option if the relevant gameinfo flag is set.
			if(!gameinfo.norandomplayerclass)
				li->SetString(0, "Random");
			for(unsigned i=0; i< PlayerClasses.Size(); i++)
			{
				const char *cls = GetPrintableDisplayName(PlayerClasses[i].Type);
				li->SetString(gameinfo.norandomplayerclass ? i : i+1, cls);
			}
			int pclass = players[consoleplayer].userinfo.GetPlayerClassNum();
			li->SetValue(0, gameinfo.norandomplayerclass && pclass >= 0 ? pclass : pclass + 1);
		}
	}

	UpdateSkins();

	li = GetItem(NAME_Gender);
	if (li != NULL)
	{
		li->SetValue(0, players[consoleplayer].userinfo.GetGender());
	}

	li = GetItem(NAME_Autoaim);
	if (li != NULL)
	{
		li->SetValue(0, (int)autoaim);
	}

	li = GetItem(NAME_Switch);
	if (li != NULL)
	{
		li->SetValue(0, neverswitchonpickup);
	}

	li = GetItem(NAME_AlwaysRun);
	if (li != NULL)
	{
		li->SetValue(0, cl_run);
	}

	if (mDesc->mSelectedItem < 0) mDesc->mSelectedItem = 1;

}